

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O1

void __thiscall
Rml::ElementText::GenerateGeometry
          (ElementText *this,RenderManager *render_manager,FontFaceHandle font_face_handle)

{
  Texture *pTVar1;
  Texture *pTVar2;
  FontEffectsHandle FVar3;
  pointer pLVar4;
  Mesh *pMVar5;
  TextureFileIndex TVar6;
  StableVectorIndex SVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  int iVar10;
  ComputedValues *this_00;
  FontEngineInterface *pFVar11;
  pointer pTVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  TexturedMeshList mesh_list;
  undefined1 local_80 [48];
  TextShapingContext text_shaping_context;
  StringView local_40;
  
  this_00 = Element::GetComputedValues(&this->super_Element);
  text_shaping_context.language = &(this_00->inherited).language;
  text_shaping_context.text_direction =
       (Direction)((uint)*(undefined4 *)&(this_00->inherited).field_0x14 >> 0x1d) & (Rtl|Ltr);
  text_shaping_context.letter_spacing = Style::ComputedValues::letter_spacing(this_00);
  ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::vector
            (&mesh_list,
             (long)(this->geometry).
                   super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->geometry).
                   super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)local_80);
  pTVar12 = (this->geometry).
            super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->geometry).
      super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
      ._M_impl.super__Vector_impl_data._M_finish != pTVar12) {
    lVar15 = 0x18;
    lVar13 = 0;
    uVar14 = 0;
    do {
      Geometry::Release((Mesh *)local_80,
                        (Geometry *)
                        ((long)&(pTVar12->geometry).
                                super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                                .render_manager + lVar13),ClearMesh);
      pMVar5 = &(mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>
                 ._M_impl.super__Vector_impl_data._M_start)->mesh;
      ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::_M_move_assign
                ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)
                 ((long)mesh_list.
                        super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar15 + -0x18),(Mesh *)local_80)
      ;
      ::std::vector<int,_std::allocator<int>_>::_M_move_assign
                ((vector<int,_std::allocator<int>_> *)
                 ((long)&(pMVar5->vertices).
                         super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar15),local_80 + 0x18);
      if ((pointer)local_80._24_8_ != (pointer)0x0) {
        operator_delete((void *)local_80._24_8_,local_80._40_8_ - local_80._24_8_);
      }
      if ((RenderManager *)local_80._0_8_ != (RenderManager *)0x0) {
        operator_delete((void *)local_80._0_8_,local_80._16_8_ - local_80._0_8_);
      }
      uVar14 = uVar14 + 1;
      pTVar12 = (this->geometry).
                super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x20;
      lVar15 = lVar15 + 0x40;
    } while (uVar14 < (ulong)((long)(this->geometry).
                                    super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar12 >> 5)
            );
  }
  if ((this->lines).
      super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->lines).
      super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar13 = 0;
    uVar14 = 0;
    do {
      pFVar11 = GetFontEngineInterface();
      FVar3 = this->font_effects_handle;
      StringView::StringView
                (&local_40,
                 (String *)
                 ((long)&(((this->lines).
                           super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>
                           ._M_impl.super__Vector_impl_data._M_start)->text)._M_dataplus._M_p +
                 lVar13));
      iVar10 = (*pFVar11->_vptr_FontEngineInterface[10])
                         ((int)*(undefined8 *)
                                ((long)&(((this->lines).
                                          super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->position).x +
                                lVar13),this->opacity,pFVar11,render_manager,font_face_handle,FVar3,
                          local_40.p_begin,local_40.p_end,(ulong)(uint)this->colour,
                          &text_shaping_context,&mesh_list);
      pLVar4 = (this->lines).
               super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(int *)((long)&pLVar4->width + lVar13) = iVar10;
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x30;
    } while (uVar14 < (ulong)(((long)(this->lines).
                                     super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar4 >> 4)
                             * -0x5555555555555555));
  }
  ::std::
  vector<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>::
  resize(&this->geometry,
         (long)mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
               _M_impl.super__Vector_impl_data._M_start >> 6);
  if ((this->geometry).
      super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->geometry).
      super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar14 = 0;
    do {
      RenderManager::MakeGeometry((RenderManager *)local_80,(Mesh *)render_manager);
      pTVar12 = (this->geometry).
                super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar14;
      UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                          *)pTVar12);
      uVar9 = local_80._8_4_;
      uVar8 = local_80._0_8_;
      local_80._0_8_ = (RenderManager *)0x0;
      (pTVar12->geometry).
      super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      .render_manager = (RenderManager *)uVar8;
      local_80._8_4_ = Invalid;
      (pTVar12->geometry).
      super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      .resource_handle = uVar9;
      UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                          *)local_80);
      pTVar1 = &mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar14].texture;
      TVar6 = pTVar1->file_index;
      SVar7 = pTVar1->callback_index;
      pTVar2 = &(this->geometry).
                super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar14].texture;
      pTVar2->render_manager = pTVar1->render_manager;
      pTVar2->file_index = TVar6;
      pTVar2->callback_index = SVar7;
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)(this->geometry).
                                    super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->geometry).
                                    super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  this->generated_decoration = None;
  this->field_0x1ec = this->field_0x1ec & 0xfe;
  ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::~vector(&mesh_list);
  return;
}

Assistant:

void ElementText::GenerateGeometry(RenderManager& render_manager, const FontFaceHandle font_face_handle)
{
	RMLUI_ZoneScopedC(0xD2691E);

	const auto& computed = GetComputedValues();
	const TextShapingContext text_shaping_context{computed.language(), computed.direction(), computed.letter_spacing()};

	// Release the old geometry, and reuse the mesh buffers.
	TexturedMeshList mesh_list(geometry.size());
	for (size_t i = 0; i < geometry.size(); i++)
		mesh_list[i].mesh = geometry[i].geometry.Release(Geometry::ReleaseMode::ClearMesh);

	// Generate the new geometry, one line at a time.
	for (size_t i = 0; i < lines.size(); ++i)
	{
		lines[i].width = GetFontEngineInterface()->GenerateString(render_manager, font_face_handle, font_effects_handle, lines[i].text,
			lines[i].position, colour, opacity, text_shaping_context, mesh_list);
	}

	// Apply the new geometry and textures.
	geometry.resize(mesh_list.size());
	for (size_t i = 0; i < geometry.size(); i++)
	{
		geometry[i].geometry = render_manager.MakeGeometry(std::move(mesh_list[i].mesh));
		geometry[i].texture = mesh_list[i].texture;
	}

	generated_decoration = Style::TextDecoration::None;
	geometry_dirty = false;
}